

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cClipControlTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ClipControlRenderBaseTest::fuzzyDepthCompare
          (ClipControlRenderBaseTest *this,TestLog *log,char *imageSetName,char *imageSetDesc,
          TextureLevel *reference,TextureLevel *result,float threshold,TextureLevel *importanceMask)

{
  ostringstream *this_00;
  TextureFormat this_01;
  ConstPixelBufferAccess *pCVar1;
  LogImage *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  bool bVar2;
  ChannelOrder __fd;
  int y;
  int y_00;
  int x;
  int x_00;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float fVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  allocator<char> local_3d2;
  allocator<char> local_3d1;
  allocator<char> local_3d0;
  allocator<char> local_3cf;
  allocator<char> local_3ce;
  allocator<char> local_3cd;
  float local_3cc;
  float local_3c8;
  uint uStack_3c4;
  uint uStack_3c0;
  uint uStack_3bc;
  Vec4 local_3b8;
  Vec4 local_3a8;
  TextureFormat local_398;
  string local_390;
  ConstPixelBufferAccess local_370;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  LogImageSet local_2a8;
  ConstPixelBufferAccess local_268;
  LogImage local_240;
  undefined1 local_1b0 [384];
  
  bVar2 = true;
  y_00 = 0;
  fVar3 = 0.0;
  uVar4 = 0;
  uVar5 = 0;
  uVar6 = 0;
  local_3cc = threshold;
  local_398 = (TextureFormat)log;
  while ((this_01 = local_398, y_00 < (result->m_size).m_data[1] && (bVar2))) {
    x_00 = 0;
    while ((x_00 < (result->m_size).m_data[0] && (bVar2 != false))) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,reference);
      local_3c8 = tcu::ConstPixelBufferAccess::getPixDepth
                            ((ConstPixelBufferAccess *)local_1b0,x_00,y_00,0);
      uStack_3c4 = extraout_XMM0_Db;
      uStack_3c0 = extraout_XMM0_Dc;
      uStack_3bc = extraout_XMM0_Dd;
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,result);
      imageSetDesc = (char *)0x0;
      fVar3 = tcu::ConstPixelBufferAccess::getPixDepth
                        ((ConstPixelBufferAccess *)local_1b0,x_00,y_00,0);
      fVar3 = ABS(local_3c8 - fVar3);
      uVar4 = uStack_3c4 & 0x7fffffff;
      uVar5 = uStack_3c0 & 0x7fffffff;
      uVar6 = uStack_3bc & 0x7fffffff;
      if (importanceMask != (TextureLevel *)0x0) {
        local_3c8 = fVar3;
        uStack_3c4 = uStack_3c4 & 0x7fffffff;
        uStack_3c0 = uStack_3c0 & 0x7fffffff;
        uStack_3bc = uStack_3bc & 0x7fffffff;
        tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,importanceMask);
        imageSetDesc = (char *)0x0;
        fVar3 = tcu::ConstPixelBufferAccess::getPixDepth
                          ((ConstPixelBufferAccess *)local_1b0,x_00,y_00,0);
        fVar3 = local_3c8 * fVar3;
        uVar4 = uStack_3c4;
        uVar5 = uStack_3c0;
        uVar6 = uStack_3bc;
      }
      x_00 = x_00 + 1;
      bVar2 = fVar3 < local_3cc;
    }
    y_00 = y_00 + 1;
  }
  if (bVar2 == false) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_4_ = local_398.order;
    local_1b0._4_4_ = local_398.type;
    local_3c8 = fVar3;
    uStack_3c4 = uVar4;
    uStack_3c0 = uVar5;
    uStack_3bc = uVar6;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Image comparison failed: difference = ");
    std::ostream::operator<<(this_00,local_3c8);
    std::operator<<((ostream *)this_00,", threshold = ");
    std::ostream::operator<<(this_00,local_3cc);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  local_3a8.m_data[0] = 0.0;
  local_3a8.m_data[1] = 0.0;
  local_3a8.m_data[2] = 0.0;
  local_3a8.m_data[3] = 0.0;
  local_3b8.m_data[0] = 1.0;
  local_3b8.m_data[1] = 1.0;
  local_3b8.m_data[2] = 1.0;
  local_3b8.m_data[3] = 1.0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"Result",&local_3cd);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Depth image comparison result",&local_3ce);
  tcu::LogImageSet::LogImageSet(&local_2a8,&local_390,&local_2c8);
  __fd = this_01.order;
  tcu::LogImageSet::write(&local_2a8,__fd,__buf,(size_t)imageSetDesc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"Result",&local_3cf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"Result",&local_3d0);
  tcu::TextureLevel::getAccess(&local_370,result);
  pCVar1 = &local_370;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,&local_2e8,&local_308,pCVar1,&local_3b8,&local_3a8,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf_00,(size_t)pCVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"Reference",&local_3d1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"Reference",&local_3d2);
  tcu::TextureLevel::getAccess(&local_268,reference);
  pCVar1 = &local_268;
  tcu::LogImage::LogImage
            (&local_240,&local_328,&local_348,pCVar1,&local_3b8,&local_3a8,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_240,__fd,__buf_01,(size_t)pCVar1);
  tcu::LogImage::~LogImage(&local_240);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  tcu::LogImage::~LogImage((LogImage *)local_1b0);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  tcu::LogImageSet::~LogImageSet(&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_390);
  if (importanceMask != (TextureLevel *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"Importance mask",(allocator<char> *)&local_268);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"mask",(allocator<char> *)&local_390);
    tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&local_240,importanceMask);
    access = &local_240;
    tcu::LogImage::LogImage
              ((LogImage *)local_1b0,&local_2a8.m_name,(string *)&local_370,
               (ConstPixelBufferAccess *)access,&local_3b8,&local_3a8,QP_IMAGE_COMPRESSION_MODE_BEST
              );
    tcu::LogImage::write((LogImage *)local_1b0,__fd,__buf_02,(size_t)access);
    tcu::LogImage::~LogImage((LogImage *)local_1b0);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_2a8);
  }
  tcu::TestLog::endImageSet((TestLog *)this_01);
  return bVar2;
}

Assistant:

bool fuzzyDepthCompare(tcu::TestLog& log, const char* imageSetName, const char* imageSetDesc,
						   const tcu::TextureLevel& reference, const tcu::TextureLevel& result, float threshold,
						   const tcu::TextureLevel* importanceMask = NULL)
	{
		(void)imageSetName;
		(void)imageSetDesc;
		bool  depthOk	= true;
		float difference = 0.0f;

		for (int y = 0; y < result.getHeight() && depthOk; y++)
		{
			for (int x = 0; x < result.getWidth() && depthOk; x++)
			{
				float ref  = reference.getAccess().getPixDepth(x, y);
				float res  = result.getAccess().getPixDepth(x, y);
				difference = std::abs(ref - res);
				if (importanceMask)
				{
					difference *= importanceMask->getAccess().getPixDepth(x, y);
				}
				depthOk &= (difference < threshold);
			}
		}

		if (!depthOk)
			log << tcu::TestLog::Message << "Image comparison failed: difference = " << difference
				<< ", threshold = " << threshold << tcu::TestLog::EndMessage;
		tcu::Vec4 pixelBias(0.0f, 0.0f, 0.0f, 0.0f);
		tcu::Vec4 pixelScale(1.0f, 1.0f, 1.0f, 1.0f);
		log << tcu::TestLog::ImageSet("Result", "Depth image comparison result")
			<< tcu::TestLog::Image("Result", "Result", result.getAccess(), pixelScale, pixelBias)
			<< tcu::TestLog::Image("Reference", "Reference", reference.getAccess(), pixelScale, pixelBias);
		if (importanceMask)
		{
			log << tcu::TestLog::Image("Importance mask", "mask", importanceMask->getAccess(), pixelScale, pixelBias);
		}
		log << tcu::TestLog::EndImageSet;

		return depthOk;
	}